

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

ON_Brep * ON_BrepBox(ON_3dPoint *box_corners,ON_Brep *pBrep)

{
  ON_CurveArray *this;
  int iVar1;
  int iVar2;
  int iVar3;
  ON_BrepVertex *pOVar4;
  ON_BrepEdge *pOVar5;
  ON_Surface *pOVar6;
  ON_3dPoint vertex_point;
  uint uVar7;
  int iVar8;
  ON_Brep *this_00;
  ON_LineCurve *pOVar9;
  ulong uVar10;
  ON_NurbsSurface *pS;
  double *pdVar11;
  ON_BrepFace *face;
  ON_BrepLoop *loop;
  ON_BrepTrim *pOVar12;
  byte bVar13;
  bool bVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  double extraout_XMM0_Qa;
  undefined1 auVar22 [16];
  double dVar23;
  ulong local_e0;
  ON_Interval s;
  ON_2dPoint p2;
  ON_2dPoint p1;
  ON_2dPoint p0;
  ON_Interval t;
  ON_2dPoint p3;
  
  if (box_corners != (ON_3dPoint *)0x0) {
    if (pBrep == (ON_Brep *)0x0) {
      this_00 = (ON_Brep *)operator_new(0x138);
      ON_Brep::ON_Brep(this_00);
    }
    else {
      ON_Brep::Destroy(pBrep);
      this_00 = pBrep;
    }
    ON_SimpleArray<ON_Curve_*>::Reserve(&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,0x18);
    this = &this_00->m_C3;
    ON_SimpleArray<ON_Curve_*>::Reserve(&this->super_ON_SimpleArray<ON_Curve_*>,0xc);
    ON_SimpleArray<ON_Surface_*>::Reserve(&(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>,6);
    ON_ClassArray<ON_BrepVertex>::Reserve((ON_ClassArray<ON_BrepVertex> *)&this_00->m_V,8);
    ON_ClassArray<ON_BrepEdge>::Reserve((ON_ClassArray<ON_BrepEdge> *)&this_00->m_E,0xc);
    ON_ClassArray<ON_BrepLoop>::Reserve((ON_ClassArray<ON_BrepLoop> *)&this_00->m_L,6);
    ON_ClassArray<ON_BrepTrim>::Reserve((ON_ClassArray<ON_BrepTrim> *)&this_00->m_T,0x18);
    ON_ClassArray<ON_BrepFace>::Reserve((ON_ClassArray<ON_BrepFace> *)&this_00->m_F,6);
    for (lVar16 = 0; lVar16 != 0xc0; lVar16 = lVar16 + 0x18) {
      vertex_point.z = *(double *)((long)&box_corners->z + lVar16);
      vertex_point._0_16_ = *(undefined1 (*) [16])((long)&box_corners->x + lVar16);
      ON_Brep::NewVertex(this_00,vertex_point,0.0);
    }
    lVar16 = 0;
    for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
      pOVar4 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      uVar7 = (int)lVar20 + 1U & 3;
      pOVar9 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar9,(ON_3dPoint *)((long)&(pOVar4->super_ON_Point).point.x + lVar16),
                 &pOVar4[uVar7].super_ON_Point.point);
      s.m_t[0] = (double)pOVar9;
      ON_SimpleArray<ON_Curve_*>::Append(&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&s);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)
                               ((long)&(pOVar4->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + lVar16),pOVar4 + uVar7,(int)lVar20,
                       (ON_Interval *)0x0,0.0);
      lVar16 = lVar16 + 0x58;
    }
    uVar17 = 4;
    for (local_e0 = 0x160; local_e0 != 0x2c0; local_e0 = local_e0 + 0x58) {
      pOVar4 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      uVar10 = uVar17 + 1 & 0xffffffff;
      if (uVar17 == 7) {
        uVar10 = 4;
      }
      pOVar9 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar9,(ON_3dPoint *)((long)&(pOVar4->super_ON_Point).point.x + local_e0),
                 &pOVar4[uVar10].super_ON_Point.point);
      s.m_t[0] = (double)pOVar9;
      ON_SimpleArray<ON_Curve_*>::Append(&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&s);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)
                               ((long)&(pOVar4->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + local_e0),pOVar4 + uVar10,(int)uVar17,
                       (ON_Interval *)0x0,0.0);
      uVar17 = uVar17 + 1;
    }
    iVar19 = 8;
    for (lVar16 = 0x10; lVar16 != 0x170; lVar16 = lVar16 + 0x58) {
      pOVar4 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      pOVar9 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar9,(ON_3dPoint *)
                        ((long)&(pOVar4->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                _vptr_ON_Object + lVar16),
                 (ON_3dPoint *)
                 ((long)&pOVar4[4].super_ON_Point.super_ON_Geometry.super_ON_Object._vptr_ON_Object
                 + lVar16));
      s.m_t[0] = (double)pOVar9;
      ON_SimpleArray<ON_Curve_*>::Append(&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&s);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)((long)pOVar4 + lVar16 + -0x10),
                       (ON_BrepVertex *)((long)&pOVar4[3].m_ei.m_count + lVar16),iVar19,
                       (ON_Interval *)0x0,0.0);
      iVar19 = iVar19 + 1;
    }
    uVar18 = 0x170;
    for (lVar16 = 0x10; dVar23 = 0.0, lVar16 != 0xd0; lVar16 = lVar16 + 0x20) {
      iVar19 = *(int *)(&DAT_006a17d0 + lVar16);
      pOVar4 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      pOVar5 = (this_00->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
      ;
      iVar1 = *(int *)(&UNK_006a17d4 + lVar16);
      iVar2 = *(int *)(&UNK_006a17d8 + lVar16);
      iVar3 = *(int *)(&UNK_006a17dc + lVar16);
      auVar22._0_4_ = -(uint)(*(int *)((long)&DAT_006a17e0 + lVar16) == 0);
      auVar22._4_4_ = -(uint)(*(int *)((long)&DAT_006a17e4 + lVar16) == 0);
      auVar22._8_4_ = -(uint)(*(int *)((long)&DAT_006a17e8 + lVar16) == 0);
      auVar22._12_4_ = -(uint)(*(int *)((long)&DAT_006a17ec + lVar16) == 0);
      uVar7 = movmskps((int)uVar18,auVar22);
      uVar15 = uVar7 ^ 0xf;
      bVar13 = (byte)uVar15;
      bVar14 = (bool)((bVar13 & 2) >> 1);
      pS = ON_NurbsSurfaceQuadrilateral
                     (&pOVar4[pOVar5[iVar19].m_vi[uVar15 & 1]].super_ON_Point.point,
                      &pOVar4[pOVar5[iVar1].m_vi[bVar14]].super_ON_Point.point,
                      &pOVar4[*(int *)((long)pOVar5[iVar2].m_vi + (ulong)(uVar15 & 4))].
                       super_ON_Point.point,
                      &pOVar4[pOVar5[iVar3].m_vi[bVar13 >> 3]].super_ON_Point.point,
                      (ON_NurbsSurface *)0x0);
      iVar8 = ON_Brep::AddSurface(this_00,&pS->super_ON_Surface);
      pOVar6 = (this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar8];
      (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar6,0);
      s.m_t[0] = extraout_XMM0_Qa;
      s.m_t[1] = dVar23;
      (*((this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar8]->super_ON_Geometry).
        super_ON_Object._vptr_ON_Object[0x26])();
      t.m_t[1] = dVar23;
      pdVar11 = ON_Interval::operator[](&s,0);
      dVar23 = *pdVar11;
      pdVar11 = ON_Interval::operator[](&t,0);
      ON_2dPoint::ON_2dPoint(&p0,dVar23,*pdVar11);
      pdVar11 = ON_Interval::operator[](&s,1);
      dVar23 = *pdVar11;
      pdVar11 = ON_Interval::operator[](&t,0);
      ON_2dPoint::ON_2dPoint(&p1,dVar23,*pdVar11);
      pdVar11 = ON_Interval::operator[](&s,1);
      dVar23 = *pdVar11;
      pdVar11 = ON_Interval::operator[](&t,1);
      ON_2dPoint::ON_2dPoint(&p2,dVar23,*pdVar11);
      pdVar11 = ON_Interval::operator[](&s,0);
      dVar23 = *pdVar11;
      pdVar11 = ON_Interval::operator[](&t,1);
      ON_2dPoint::ON_2dPoint(&p3,dVar23,*pdVar11);
      face = ON_Brep::NewFace(this_00,iVar8);
      loop = ON_Brep::NewLoop(this_00,outer,face);
      pdVar11 = ON_Interval::operator[](&s,0);
      (loop->m_pbox).m_min.x = *pdVar11;
      pdVar11 = ON_Interval::operator[](&t,0);
      (loop->m_pbox).m_min.y = *pdVar11;
      (loop->m_pbox).m_min.z = 0.0;
      pdVar11 = ON_Interval::operator[](&s,1);
      (loop->m_pbox).m_max.x = *pdVar11;
      pdVar11 = ON_Interval::operator[](&t,1);
      (loop->m_pbox).m_max.y = *pdVar11;
      (loop->m_pbox).m_max.z = 0.0;
      pOVar9 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar9,&p0,&p1);
      iVar8 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar9);
      local_e0 = (ulong)uVar7 ^ 0xf;
      pOVar12 = ON_Brep::NewTrim(this_00,pOVar5 + iVar19,(bool)(bVar13 & 1),loop,iVar8);
      pOVar12->m_tolerance[0] = 0.0;
      pOVar12->m_tolerance[1] = 0.0;
      bVar21 = pOVar12->m_vi[0] == pOVar12->m_vi[1];
      pOVar12->m_type = bVar21 + 2 + (uint)bVar21;
      pOVar12->m_iso = S_iso;
      pOVar9 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar9,&p1,&p2);
      iVar19 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar9);
      pOVar12 = ON_Brep::NewTrim(this_00,pOVar5 + iVar1,bVar14,loop,iVar19);
      pOVar12->m_tolerance[0] = 0.0;
      pOVar12->m_tolerance[1] = 0.0;
      bVar14 = pOVar12->m_vi[0] == pOVar12->m_vi[1];
      pOVar12->m_type = bVar14 + 2 + (uint)bVar14;
      pOVar12->m_iso = E_iso;
      pOVar9 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar9,&p2,&p3);
      bVar14 = (bool)((byte)(local_e0 & 0xffffff04) >> 2);
      uVar18 = CONCAT71((int7)((local_e0 & 0xffffff04) >> 8),bVar14);
      iVar19 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar9);
      pOVar12 = ON_Brep::NewTrim(this_00,pOVar5 + iVar2,bVar14,loop,iVar19);
      pOVar12->m_tolerance[0] = 0.0;
      pOVar12->m_tolerance[1] = 0.0;
      bVar14 = pOVar12->m_vi[0] == pOVar12->m_vi[1];
      pOVar12->m_type = bVar14 + 2 + (uint)bVar14;
      pOVar12->m_iso = N_iso;
      pOVar9 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar9,&p3,&p0);
      iVar19 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar9);
      pOVar12 = ON_Brep::NewTrim(this_00,pOVar5 + iVar3,(bool)(bVar13 >> 3),loop,iVar19);
      pOVar12->m_tolerance[0] = 0.0;
      pOVar12->m_tolerance[1] = 0.0;
      bVar14 = pOVar12->m_vi[0] == pOVar12->m_vi[1];
      pOVar12->m_type = bVar14 + 2 + (uint)bVar14;
      pOVar12->m_iso = W_iso;
    }
    iVar19 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this_00,0);
    if ((char)iVar19 != '\0') {
      return this_00;
    }
    if (pBrep == (ON_Brep *)0x0) {
      (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
    }
    else {
      ON_Brep::Destroy(pBrep);
    }
  }
  return (ON_Brep *)0x0;
}

Assistant:

ON_Brep* ON_BrepBox( const ON_3dPoint* box_corners, ON_Brep* pBrep )
{
  ON_Brep* brep = 0;
  int vi, ei, fi, si, c2i;
  if (box_corners)
  {
    if ( pBrep ) {
      pBrep->Destroy();
      brep = pBrep;
    }
    else
      brep = new ON_Brep();
    brep->m_C2.Reserve(24);
    brep->m_C3.Reserve(12);
    brep->m_S.Reserve(6);
    brep->m_V.Reserve(8);
    brep->m_E.Reserve(12);
    brep->m_L.Reserve(6);
    brep->m_T.Reserve(24);
    brep->m_F.Reserve(6);
    for ( vi = 0; vi < 8; vi++ )
    {
      brep->NewVertex( box_corners[vi], 0.0 );
    }
    for ( ei = 0; ei < 4; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[(ei+1)%4];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    for ( ei = 4; ei < 8; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[ei==7?4:(ei+1)];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    for ( ei = 8; ei < 12; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei-8];
      ON_BrepVertex& v1 = brep->m_V[ei-4];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }

    /*
    //           v7_______e6_____v6
    //            |\             |\
    //            | e7           | e5
    //            |  \ ______e4_____\ 
    //           e11  v4         |   v5
    //            |   |        e10   |
    //            |   |          |   |
    //            3---|---e2-----2   e9
    //            \   e8         \   |
    //             e3 |           e1 |
    //              \ |            \ |
    //               \v0_____e0_____\v1
    */

    struct {
      int e[4], bRev[4];
    } f[6] = {
      {{0, 9, 4, 8},  {false, false, true,  true}},
      {{1,10, 5, 9},  {false, false, true,  true}},
      {{2,11, 6,10},  {false, false, true,  true}},
      {{3, 8, 7,11},  {false, false, true,  true}},
      {{3, 2, 1, 0},  {true,  true,  true,  true}},
      {{4, 5, 6, 7},  {false, false, false, false}}
    };
    for ( fi = 0; fi < 6; fi++ )
    {
      ON_BrepEdge& e0 = brep->m_E[f[fi].e[0]];
      ON_BrepEdge& e1 = brep->m_E[f[fi].e[1]];
      ON_BrepEdge& e2 = brep->m_E[f[fi].e[2]];
      ON_BrepEdge& e3 = brep->m_E[f[fi].e[3]];
      ON_BrepVertex& v0 = brep->m_V[e0.m_vi[f[fi].bRev[0]?1:0]];
      ON_BrepVertex& v1 = brep->m_V[e1.m_vi[f[fi].bRev[1]?1:0]];
      ON_BrepVertex& v2 = brep->m_V[e2.m_vi[f[fi].bRev[2]?1:0]];
      ON_BrepVertex& v3 = brep->m_V[e3.m_vi[f[fi].bRev[3]?1:0]];

      si = brep->AddSurface( ON_NurbsSurfaceQuadrilateral( v0.point, v1.point, v2.point, v3.point ) );
      ON_Interval s = brep->m_S[si]->Domain(0);
      ON_Interval t = brep->m_S[si]->Domain(1);
      ON_2dPoint p0(s[0],t[0]);
      ON_2dPoint p1(s[1],t[0]);
      ON_2dPoint p2(s[1],t[1]);
      ON_2dPoint p3(s[0],t[1]);

      ON_BrepFace& face = brep->NewFace( si );
      ON_BrepLoop& loop = brep->NewLoop( ON_BrepLoop::outer, face );

      loop.m_pbox.m_min.x = s[0];
      loop.m_pbox.m_min.y = t[0];
      loop.m_pbox.m_min.z = 0.0;

      loop.m_pbox.m_max.x = s[1];
      loop.m_pbox.m_max.y = t[1];
      loop.m_pbox.m_max.z = 0.0;

      // south side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
      ON_BrepTrim& trim0 = brep->NewTrim( e0, f[fi].bRev[0], loop, c2i );
      trim0.m_tolerance[0] = 0.0;
      trim0.m_tolerance[1] = 0.0;
      trim0.m_type = (trim0.m_vi[0] != trim0.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim0.m_iso = ON_Surface::S_iso;

      // east side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p2 ) );
      ON_BrepTrim& trim1 = brep->NewTrim( e1, f[fi].bRev[1], loop, c2i );
      trim1.m_tolerance[0] = 0.0;
      trim1.m_tolerance[1] = 0.0;
      trim1.m_type = (trim1.m_vi[0] != trim1.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim1.m_iso = ON_Surface::E_iso;

      // north side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p2, p3 ) );
      ON_BrepTrim& trim2 = brep->NewTrim( e2, f[fi].bRev[2], loop, c2i );
      trim2.m_tolerance[0] = 0.0;
      trim2.m_tolerance[1] = 0.0;
      trim2.m_type = (trim2.m_vi[0] != trim2.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim2.m_iso = ON_Surface::N_iso;

      // west side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
      ON_BrepTrim& trim3 = brep->NewTrim( e3, f[fi].bRev[3], loop, c2i );
      trim3.m_tolerance[0] = 0.0;
      trim3.m_tolerance[1] = 0.0;
      trim3.m_type = (trim3.m_vi[0] != trim3.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim3.m_iso = ON_Surface::W_iso;
    }
    if ( !brep->IsValid() ) {
      if ( pBrep )
        pBrep->Destroy();
      else
        delete brep;
      brep = 0;
    }
  }
  else 
    brep = 0;
  return brep;
}